

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O0

void pbrt::Log<unsigned_long,double,double,double,double>
               (LogLevel level,char *file,int line,char *fmt,unsigned_long *args,double *args_1,
               double *args_2,double *args_3,double *args_4)

{
  double *in_RCX;
  string s;
  char *in_stack_00000088;
  double *in_stack_ffffffffffffffa8;
  double *in_stack_ffffffffffffffb0;
  double *in_stack_ffffffffffffffb8;
  unsigned_long *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  StringPrintf<unsigned_long,double,double,double,double>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RCX);
  std::__cxx11::string::c_str();
  Log(args_4._4_4_,(char *)args_3,args_2._4_4_,in_stack_00000088);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  return;
}

Assistant:

inline void Log(LogLevel level, const char *file, int line, const char *fmt,
                Args &&...args) {
#ifdef PBRT_IS_GPU_CODE
    Log(level, file, line, fmt);  // just the format string #yolo
#else
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    Log(level, file, line, s.c_str());
#endif
}